

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseArray.h
# Opt level: O0

SparseArray<Value> * SparseArray<Value>::New(ArenaAllocator *allocator,uint32 chunkSize)

{
  bool bVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  SparseArray<Value> *__s;
  TrackAllocData local_48;
  SparseArray<Value> *array;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAStack_10;
  uint32 chunkSize_local;
  ArenaAllocator *allocator_local;
  
  array._4_4_ = chunkSize;
  pAStack_10 = &allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  bVar1 = Math::IsPow2(chunkSize);
  if (!bVar1) {
    array._4_4_ = Math::NextPowerOf2(array._4_4_);
  }
  UInt32Math::MulAdd<8u,16u>(array._4_4_);
  pAVar2 = pAStack_10;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SparseArray.h"
             ,0x25);
  pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar2,&local_48);
  __s = (SparseArray<Value> *)new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar2,0x3f67b0);
  memset(__s,0,0x18);
  __s->alloc = (ArenaAllocator *)pAStack_10;
  __s->chunkSize = array._4_4_;
  __s->firstChunk = (SAChunk<Value> *)0x0;
  return __s;
}

Assistant:

static SparseArray<T> * New(ArenaAllocator *allocator, uint32 chunkSize)
    {
        SparseArray<T> * array;

        if (!Math::IsPow2(chunkSize))
        {
            chunkSize = Math::NextPowerOf2(chunkSize);
        }

        // Throw early if this overflows, since chunkSize never changes, subsequent operations will be safe
        UInt32Math::MulAdd<sizeof(T*), sizeof(SAChunk<T>)>(chunkSize);
        array = Anew(allocator, SparseArray<T>);
        array->alloc = allocator;
        array->chunkSize = chunkSize;
        array->firstChunk = NULL;

        return array;
    }